

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_activate(ssh_sharing_state *sharestate,char *server_verstring)

{
  size_t sVar1;
  char *pcVar2;
  ssh_sharing_connstate *cs_00;
  int local_24;
  int i;
  ssh_sharing_connstate *cs;
  char *server_verstring_local;
  ssh_sharing_state *sharestate_local;
  
  cs = (ssh_sharing_connstate *)server_verstring;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    sVar1 = strcspn((char *)cs,"-");
    cs = (ssh_sharing_connstate *)(cs->recvbuf + (sVar1 - 0x24));
    if ((uchar)cs->id != '\0') {
      cs = (ssh_sharing_connstate *)((long)&cs->id + 1);
    }
  }
  pcVar2 = dupstr((char *)cs);
  sharestate->server_verstring = pcVar2;
  local_24 = 0;
  while( true ) {
    cs_00 = (ssh_sharing_connstate *)index234(sharestate->connections,local_24);
    if (cs_00 == (ssh_sharing_connstate *)0x0) {
      return;
    }
    if ((cs_00->sent_verstring & 1U) != 0) break;
    share_send_verstring(cs_00);
    local_24 = local_24 + 1;
  }
  __assert_fail("!cs->sent_verstring",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                0x769,"void share_activate(ssh_sharing_state *, const char *)");
}

Assistant:

void share_activate(ssh_sharing_state *sharestate,
                    const char *server_verstring)
{
    /*
     * Indication from connection layer that we are now ready to begin
     * serving any downstreams that have already connected to us.
     */
    struct ssh_sharing_connstate *cs;
    int i;

    /*
     * Trim the server's version string down to just the software
     * version component, removing "SSH-2.0-" or whatever at the
     * front.
     */
    for (i = 0; i < 2; i++) {
        server_verstring += strcspn(server_verstring, "-");
        if (*server_verstring)
            server_verstring++;
    }

    sharestate->server_verstring = dupstr(server_verstring);

    for (i = 0; (cs = (struct ssh_sharing_connstate *)
                 index234(sharestate->connections, i)) != NULL; i++) {
        assert(!cs->sent_verstring);
        share_send_verstring(cs);
    }
}